

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CuTest.c
# Opt level: O3

void CuStringInsert(CuString *str,char *text,int pos)

{
  int iVar1;
  int iVar2;
  int iVar3;
  size_t sVar4;
  char *pcVar5;
  
  sVar4 = strlen(text);
  iVar1 = str->length;
  iVar2 = (int)sVar4;
  if (iVar2 + iVar1 + 1 < str->size) {
    pcVar5 = str->buffer;
    iVar3 = iVar1;
  }
  else {
    iVar3 = iVar2 + iVar1 + 0x101;
    pcVar5 = (char *)realloc(str->buffer,(long)iVar3);
    str->buffer = pcVar5;
    str->size = iVar3;
    iVar3 = str->length;
  }
  if (iVar1 < pos) {
    pos = iVar1;
  }
  memmove(pcVar5 + pos + iVar2,pcVar5 + pos,(long)((iVar3 - pos) + 1));
  str->length = str->length + iVar2;
  memcpy(str->buffer + pos,text,(long)iVar2);
  return;
}

Assistant:

void CuStringInsert(CuString* str, const char* text, int pos)
{
	int length = strlen(text);
	if (pos > str->length)
		pos = str->length;
	if (str->length + length + 1 >= str->size)
		CuStringResize(str, str->length + length + 1 + STRING_INC);
	memmove(str->buffer + pos + length, str->buffer + pos, (str->length - pos) + 1);
	str->length += length;
	memcpy(str->buffer + pos, text, length);
}